

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testString.cxx
# Opt level: O2

bool testFromChar(String *str)

{
  bool bVar1;
  ostream *poVar2;
  int iVar3;
  char *pcVar4;
  
  if ((str->view_)._M_len == 1) {
    if (*(str->view_)._M_str == 'a') {
      bVar1 = cm::String::is_stable(str);
      if (bVar1) {
        return true;
      }
      iVar3 = 0xd0;
      pcVar4 = "ASSERT_TRUE(str.is_stable()) failed on line ";
    }
    else {
      iVar3 = 0xcf;
      pcVar4 = "ASSERT_TRUE(std::strncmp(str.data(), \"a\", 1) == 0) failed on line ";
    }
  }
  else {
    iVar3 = 0xce;
    pcVar4 = "ASSERT_TRUE(str.size() == 1) failed on line ";
  }
  poVar2 = std::operator<<((ostream *)&std::cout,pcVar4);
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar3);
  std::operator<<(poVar2,"\n");
  return false;
}

Assistant:

static bool testFromChar(cm::String const& str)
{
  ASSERT_TRUE(str.size() == 1);
  ASSERT_TRUE(std::strncmp(str.data(), "a", 1) == 0);
  ASSERT_TRUE(str.is_stable());
  return true;
}